

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_holder.cc
# Opt level: O3

void callHello(ObjectHolder *oh)

{
  Object::hello((oh->super_shared_ptr<Object>).
                super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Object::hello((oh->super_shared_ptr<Object>).
                super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Object::hello((oh->super_shared_ptr<Object>).
                super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void
callHello(ObjectHolder& oh)
{
    oh.getPointer()->hello();
    oh->hello();
    (*oh).hello();
}